

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdlFbInterfaces.h
# Opt level: O3

IConfigEntry * __thiscall
Firebird::IConfig::find<Firebird::ThrowStatusWrapper>
          (IConfig *this,ThrowStatusWrapper *status,char *name)

{
  IConfigEntry *pIVar1;
  
  if ((status->super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>).dirty == true) {
    (status->super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>).dirty = false;
    (*(code *)(((status->super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>).status)->
              super_IDisposable).super_IVersioned.cloopVTable[1].version)();
  }
  pIVar1 = (IConfigEntry *)
           (**(code **)(*(long *)(this + 8) + 0x20))
                     (this,(IVersionedBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
                            *)((long)&(status->super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>
                                      ).
                                      super_IStatusImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>_>
                                      .
                                      super_IStatusBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>_>
                                      .
                                      super_IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
                                      .
                                      super_IDisposableBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
                                      .
                                      super_Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>
                                      .
                                      super_IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
                              + 8),name);
  ThrowStatusWrapper::checkException(status);
  return pIVar1;
}

Assistant:

IConfigEntry* find(StatusType* status, const char* name)
		{
			StatusType::clearException(status);
			IConfigEntry* ret = static_cast<VTable*>(this->cloopVTable)->find(this, status, name);
			StatusType::checkException(status);
			return ret;
		}